

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcomplex.c
# Opt level: O1

void z_div(doublecomplex *c,doublecomplex *a,doublecomplex *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = b->r;
  dVar2 = b->i;
  dVar1 = -dVar4;
  if (-dVar4 <= dVar4) {
    dVar1 = dVar4;
  }
  dVar3 = -dVar2;
  if (-dVar2 <= dVar2) {
    dVar3 = dVar2;
  }
  if (dVar1 <= dVar3) {
    if ((dVar2 == 0.0) && (!NAN(dVar2))) {
      z_div_cold_1();
      dVar4 = c->r;
      dVar2 = c->i;
      dVar1 = -dVar4;
      if (-dVar4 <= dVar4) {
        dVar1 = dVar4;
      }
      dVar4 = -dVar2;
      if (-dVar2 <= dVar2) {
        dVar4 = dVar2;
      }
      dVar2 = dVar4;
      if (dVar4 <= dVar1) {
        dVar2 = dVar1;
      }
      if ((dVar1 + dVar4 != dVar2) || (NAN(dVar1 + dVar4) || NAN(dVar2))) {
        if (dVar4 <= dVar1) {
          dVar1 = dVar4;
        }
        dVar4 = (dVar1 / dVar2) * (dVar1 / dVar2) + 1.0;
        if (dVar4 < 0.0) {
          sqrt(dVar4);
        }
      }
      return;
    }
    dVar1 = dVar4 / dVar2;
    dVar4 = (dVar1 * dVar1 + 1.0) * dVar2;
    dVar2 = a->r;
    dVar3 = (dVar2 * dVar1 + a->i) / dVar4;
    dVar1 = dVar1 * a->i;
  }
  else {
    dVar2 = dVar2 / dVar4;
    dVar4 = (dVar2 * dVar2 + 1.0) * dVar4;
    dVar1 = a->i;
    dVar3 = (dVar1 * dVar2 + a->r) / dVar4;
    dVar2 = dVar2 * a->r;
  }
  c->r = dVar3;
  c->i = (dVar1 - dVar2) / dVar4;
  return;
}

Assistant:

void z_div(doublecomplex *c, const doublecomplex *a, const doublecomplex *b)
{
    double ratio, den;
    double abr, abi, cr, ci;
  
    if( (abr = b->r) < 0.)
	abr = - abr;
    if( (abi = b->i) < 0.)
	abi = - abi;
    if( abr <= abi ) {
	if (abi == 0) {
	    fprintf(stderr, "z_div.c: division by zero\n");
            exit(-1);
	}	  
	ratio = b->r / b->i ;
	den = b->i * (1 + ratio*ratio);
	cr = (a->r*ratio + a->i) / den;
	ci = (a->i*ratio - a->r) / den;
    } else {
	ratio = b->i / b->r ;
	den = b->r * (1 + ratio*ratio);
	cr = (a->r + a->i*ratio) / den;
	ci = (a->i - a->r*ratio) / den;
    }
    c->r = cr;
    c->i = ci;
}